

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_bv_base.cpp
# Opt level: O2

void __thiscall sc_dt::sc_bv_base::assign_from_string(sc_bv_base *this,string *s)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char cVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  value_type value;
  
  uVar2 = this->m_len;
  iVar5 = (int)s->_M_string_length;
  uVar1 = iVar5 - 1;
  uVar7 = uVar1;
  if ((int)uVar2 < (int)uVar1) {
    uVar7 = uVar2;
  }
  uVar6 = 0;
  uVar8 = (ulong)uVar7;
  if ((int)uVar7 < 1) {
    uVar8 = uVar6;
  }
  iVar5 = iVar5 + -2;
  for (; uVar8 != uVar6; uVar6 = uVar6 + 1) {
    cVar4 = (s->_M_dataplus)._M_p[iVar5];
    if ((byte)(cVar4 - 0x32U) < 0xfe) {
      sc_core::sc_report_handler::report
                (SC_ERROR,"cannot perform conversion",
                 "string can contain only \'0\' and \'1\' characters",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ucirvinelecs[P]systemc/src/sysc/datatypes/bit/sc_bv_base.cpp"
                 ,0x6b);
      cVar4 = '0';
    }
    set_bit(this,(int)uVar6,cVar4 != '0');
    iVar5 = iVar5 + -1;
  }
  pcVar3 = (s->_M_dataplus)._M_p;
  if (pcVar3[(int)uVar1] == 'F') {
    value = *pcVar3 != '0';
  }
  else {
    value = false;
  }
  while (iVar5 = (int)uVar8, iVar5 < (int)uVar2) {
    set_bit(this,iVar5,value);
    uVar8 = (ulong)(iVar5 + 1);
  }
  return;
}

Assistant:

void
sc_bv_base::assign_from_string( const std::string& s )
{
    // s must have been converted to bin
    int len = m_len;
    int s_len = s.length() - 1;
    int min_len = sc_min( len, s_len );
    int i = 0;
    for( ; i < min_len; ++ i ) {
        char c = s[s_len - i - 1];
        if( c != '0' && c != '1' ) {
            SC_REPORT_ERROR( sc_core::SC_ID_CANNOT_CONVERT_,
                "string can contain only '0' and '1' characters" );
            // may continue, if suppressed
            c = '0';
        }
        set_bit( i, sc_logic_value_t( c - '0' ) );
    }
    // if formatted, fill the rest with sign(s), otherwise fill with zeros
    sc_logic_value_t fill = (s[s_len] == 'F' ? sc_logic_value_t( s[0] - '0' )
                                             : sc_logic_value_t( 0 ));
    for( ; i < len; ++ i ) {
        set_bit( i, fill );
    }
}